

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

FloatParts sf_canonicalize(FloatParts part,FloatFmt *parm,float_status *status)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  FloatParts FVar6;
  
  uVar4 = part._8_8_;
  uVar2 = part.frac;
  iVar3 = part.exp;
  if ((parm->exp_max == iVar3) && (parm->arm_althp == false)) {
    if (uVar2 == 0) {
      uVar4 = uVar4 & 0xffffff00ffffffff | 0x300000000;
      uVar2 = 0;
    }
    else {
      uVar2 = uVar2 << ((byte)parm->frac_shift & 0x3f);
      uVar4 = uVar4 & 0xffffff00ffffffff | (ulong)((uVar2 & 0x2000000000000000) == 0) << 0x20 |
              0x400000000;
    }
  }
  else if (iVar3 == 0) {
    if (uVar2 != 0) {
      if (status->flush_inputs_to_zero == '\0') {
        lVar1 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar5 = (uint)lVar1 ^ 0x3f;
        uVar4 = (ulong)((parm->frac_shift - (uVar5 + parm->exp_bias)) + 2) |
                uVar4 & 0xffffff0000000000 | 0x200000000;
        uVar2 = uVar2 << ((char)uVar5 - 1U & 0x3f);
        goto LAB_00cfda65;
      }
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
    uVar4 = uVar4 & 0xffffff0000000000 | 0x100000000;
    uVar2 = 0;
  }
  else {
    uVar4 = (ulong)(uint)(iVar3 - parm->exp_bias) | uVar4 & 0xffffff0000000000 | 0x200000000;
    uVar2 = (uVar2 << ((byte)parm->frac_shift & 0x3f)) + 0x4000000000000000;
  }
LAB_00cfda65:
  FVar6.exp = (int)uVar4;
  FVar6.cls = (char)(uVar4 >> 0x20);
  FVar6.sign = (_Bool)(char)(uVar4 >> 0x28);
  FVar6._14_2_ = (short)(uVar4 >> 0x30);
  FVar6.frac = uVar2;
  return FVar6;
}

Assistant:

static FloatParts sf_canonicalize(FloatParts part, const FloatFmt *parm,
                                  float_status *status)
{
    if (part.exp == parm->exp_max && !parm->arm_althp) {
        if (part.frac == 0) {
            part.cls = float_class_inf;
        } else {
            part.frac <<= parm->frac_shift;
            part.cls = (parts_is_snan_frac(part.frac, status)
                        ? float_class_snan : float_class_qnan);
        }
    } else if (part.exp == 0) {
        if (likely(part.frac == 0)) {
            part.cls = float_class_zero;
        } else if (status->flush_inputs_to_zero) {
            float_raise(float_flag_input_denormal, status);
            part.cls = float_class_zero;
            part.frac = 0;
        } else {
            int shift = clz64(part.frac) - 1;
            part.cls = float_class_normal;
            part.exp = parm->frac_shift - parm->exp_bias - shift + 1;
            part.frac <<= shift;
        }
    } else {
        part.cls = float_class_normal;
        part.exp -= parm->exp_bias;
        part.frac = DECOMPOSED_IMPLICIT_BIT + (part.frac << parm->frac_shift);
    }
    return part;
}